

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::ReadBasicNodeInfo_Ascii
          (COBImporter *this,Node *msh,LineSplitter *splitter,ChunkInfo *param_3)

{
  bool bVar1;
  char *__s;
  LineSplitter *this_00;
  float *pfVar2;
  ai_real aVar3;
  bool local_99;
  uint local_84;
  char *pcStack_80;
  uint x;
  char *s;
  uint y;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  allocator<char> local_49;
  string local_48 [32];
  ChunkInfo *local_28;
  ChunkInfo *param_3_local;
  LineSplitter *splitter_local;
  Node *msh_local;
  COBImporter *this_local;
  
  local_28 = param_3;
  param_3_local = (ChunkInfo *)splitter;
  splitter_local = (LineSplitter *)msh;
  msh_local = (Node *)this;
  do {
    bVar1 = LineSplitter::operator_cast_to_bool((LineSplitter *)param_3_local);
    if (!bVar1) {
      return;
    }
    bVar1 = LineSplitter::match_start((LineSplitter *)param_3_local,"Name");
    if (bVar1) {
      __s = LineSplitter::operator[]((LineSplitter *)param_3_local,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_48,__s,&local_49);
      std::__cxx11::string::operator=((string *)(splitter_local + 2),local_48);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator(&local_49);
      local_68._M_current = (char *)std::__cxx11::string::begin();
      _y = (char *)std::__cxx11::string::end();
      s._7_1_ = 0x2c;
      s._6_1_ = 0x5f;
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_68,_y,(char *)((long)&s + 7),(char *)((long)&s + 6));
    }
    else {
      bVar1 = LineSplitter::match_start((LineSplitter *)param_3_local,"Transform");
      if (bVar1) {
        s._0_4_ = 0;
        while( true ) {
          local_99 = false;
          if ((uint)s < 4) {
            this_00 = LineSplitter::operator++((LineSplitter *)param_3_local);
            local_99 = LineSplitter::operator_cast_to_bool(this_00);
          }
          if (local_99 == false) break;
          LineSplitter::operator->[abi_cxx11_((LineSplitter *)param_3_local);
          pcStack_80 = (char *)std::__cxx11::string::c_str();
          for (local_84 = 0; local_84 < 4; local_84 = local_84 + 1) {
            SkipSpaces<char>(&stack0xffffffffffffff80);
            aVar3 = fast_atof(&stack0xffffffffffffff80);
            pfVar2 = aiMatrix4x4t<float>::operator[]
                               ((aiMatrix4x4t<float> *)((long)&splitter_local[2].mCur.field_2 + 8),
                                (uint)s);
            pfVar2[local_84] = aVar3;
          }
          s._0_4_ = (uint)s + 1;
        }
        return;
      }
    }
    LineSplitter::operator++((LineSplitter *)param_3_local);
  } while( true );
}

Assistant:

void COBImporter::ReadBasicNodeInfo_Ascii(Node& msh, LineSplitter& splitter, const ChunkInfo& /*nfo*/)
{
    for(;splitter;++splitter) {
        if (splitter.match_start("Name")) {
            msh.name = std::string(splitter[1]);

            // make nice names by merging the dupe count
            std::replace(msh.name.begin(),msh.name.end(),
                ',','_');
        }
        else if (splitter.match_start("Transform")) {
            for(unsigned int y = 0; y < 4 && ++splitter; ++y) {
                const char* s = splitter->c_str();
                for(unsigned int x = 0; x < 4; ++x) {
                    SkipSpaces(&s);
                    msh.transform[y][x] = fast_atof(&s);
                }
            }
            // we need the transform chunk, so we won't return until we have it.
            return;
        }
    }
}